

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void __thiscall QString::QString(QString *this,qsizetype size,Initialization param_2)

{
  char16_t *pcVar1;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char16_t *)0x0;
  (this->d).size = 0;
  if (size < 1) {
    local_38.d = (Data *)0x0;
    local_38.ptr = L"";
    local_38.size = 0;
    QArrayDataPointer<char16_t>::operator=(&this->d,&local_38);
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char16_t *)QArrayData::allocate2((QArrayData **)&local_38,size,KeepSize);
    local_38.size = size;
    QArrayDataPointer<char16_t>::operator=(&this->d,&local_38);
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,2,0x10);
      }
    }
    pcVar1 = (this->d).ptr;
    if (pcVar1 == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        qBadAlloc();
      }
      goto LAB_0032989b;
    }
    pcVar1[size] = L'\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0032989b:
  __stack_chk_fail();
}

Assistant:

QString::QString(qsizetype size, Qt::Initialization)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
    }
}